

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O2

int lj_trace_exit(jit_State *J,void *exptr)

{
  char cVar1;
  lua_State *L;
  long lVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  ptrdiff_t argbase;
  TValue *pTVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  BCIns *pBVar10;
  ulong uVar11;
  ExitDataCP exd;
  
  piVar5 = __errno_location();
  iVar4 = *piVar5;
  L = J->L;
  exd.J = J;
  exd.exptr = exptr;
  iVar3 = lj_vm_cpcall(L,0,&exd,trace_exit_cp);
  if (iVar3 != 0) {
    return -iVar3;
  }
  if (((*(byte *)((ulong)(L->glref).ptr32 + 0x93) & 8) != 0) &&
     (argbase = lj_vmevent_prepare(L,LJ_VMEVENT_TEXIT), argbase != 0)) {
    pTVar6 = L->top;
    if ((long)((ulong)(L->maxstack).ptr32 - (long)pTVar6) < 0x1c1) {
      lj_state_growstack(L,0x38);
      pTVar6 = L->top;
    }
    L->top = pTVar6 + 1;
    pTVar6->n = (double)(int)J->parent;
    pTVar6 = L->top;
    L->top = pTVar6 + 1;
    pTVar6->n = (double)(int)J->exitno;
    pTVar6 = L->top;
    L->top = pTVar6 + 1;
    pTVar6->u64 = 0x4030000000000000;
    pTVar6 = L->top;
    L->top = pTVar6 + 1;
    pTVar6->u64 = 0x4030000000000000;
    for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
      lVar2 = *(long *)((long)exptr + lVar7 * 8 + 0x80);
      pTVar6 = L->top;
      L->top = pTVar6 + 1;
      pTVar6->n = (double)lVar2;
    }
    for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
      *L->top = *(TValue *)((long)exptr + lVar7 * 8);
      pTVar6 = L->top;
      if (NAN(pTVar6->n)) {
        pTVar6->u64 = 0xfff8000000000000;
        pTVar6 = L->top;
      }
      L->top = pTVar6 + 1;
    }
    lj_vmevent_call(L,argbase);
  }
  uVar11 = (ulong)L->cframe & 0xfffffffffffffffc;
  *(int *)(uVar11 + 0x1c) = (int)exd.pc;
  uVar8 = (ulong)(L->glref).ptr32;
  cVar1 = *(char *)(uVar8 + 0x29);
  if ((cVar1 == '\x05') || (cVar1 == '\x02')) {
    if ((*(byte *)(uVar8 + 0x91) & 0x40) == 0) {
      lj_gc_step(L);
    }
  }
  else if ((J[-1].penalty[0x3d].pc.ptr32 & 0x6000) == 0) {
    lVar7 = *(long *)((ulong)J->trace[J->parent].gcptr32 + 0x20);
    uVar9 = (uint)*(byte *)(lVar7 + 7 + (ulong)J->exitno * 8);
    if ((uVar9 != 0xff) &&
       (iVar3 = uVar9 + 1, *(char *)(lVar7 + 7 + (ulong)J->exitno * 8) = (char)iVar3,
       J->param[6] <= iVar3)) {
      J->state = LJ_TRACE_START;
      lj_trace_ins(J,exd.pc);
    }
  }
  uVar9 = *exd.pc;
  pBVar10 = exd.pc;
  if (((char)uVar9 == 'S') &&
     (uVar8 = (ulong)J->trace[uVar9 >> 0x10].gcptr32, 0xfffffffb < *(byte *)(uVar8 + 0x38) - 0x49))
  {
    pBVar10 = (BCIns *)(uVar8 + 0x38);
    if (J->state == LJ_TRACE_RECORD) {
      J->patchins = uVar9;
      J->patchpc = exd.pc;
      *exd.pc = *pBVar10;
      J->bcskip = '\x01';
      pBVar10 = exd.pc;
    }
    else {
      *(int *)(uVar11 + 0x1c) = (int)pBVar10;
    }
  }
  *piVar5 = iVar4;
  uVar9 = *pBVar10;
  switch(uVar9 & 0xff) {
  case 0x3c:
    iVar4 = (int)((ulong)((long)L->top - (long)L->base) >> 3);
    uVar9 = uVar9 >> 8 & 0xff;
    break;
  case 0x3d:
  case 0x3f:
    return (int)((ulong)((long)L->top - (long)L->base) >> 3) -
           ((uVar9 >> 0x10 & 0xff) + (uVar9 >> 8 & 0xff));
  default:
    if ((uVar9 & 0xff) < 0x55) {
      return 0;
    }
    iVar4 = (int)((ulong)((long)L->top - (long)L->base) >> 3);
    goto LAB_00111364;
  case 0x45:
    iVar4 = (int)((ulong)((long)L->top - (long)L->base) >> 3);
    uVar9 = (uVar9 >> 0x10) + (uVar9 >> 8 & 0xff);
  }
  iVar4 = iVar4 - uVar9;
LAB_00111364:
  return iVar4 + 1;
}

Assistant:

int LJ_FASTCALL lj_trace_exit(jit_State *J, void *exptr)
{
  ERRNO_SAVE
  lua_State *L = J->L;
  ExitState *ex = (ExitState *)exptr;
  ExitDataCP exd;
  int errcode;
  const BCIns *pc;
  void *cf;
  GCtrace *T;
#ifdef EXITSTATE_PCREG
  J->parent = trace_exit_find(J, (MCode *)(intptr_t)ex->gpr[EXITSTATE_PCREG]);
#endif
  T = traceref(J, J->parent); UNUSED(T);
#ifdef EXITSTATE_CHECKEXIT
  if (J->exitno == T->nsnap) {  /* Treat stack check like a parent exit. */
    lua_assert(T->root != 0);
    J->exitno = T->ir[REF_BASE].op2;
    J->parent = T->ir[REF_BASE].op1;
    T = traceref(J, J->parent);
  }
#endif
  lua_assert(T != NULL && J->exitno < T->nsnap);
  exd.J = J;
  exd.exptr = exptr;
  errcode = lj_vm_cpcall(L, NULL, &exd, trace_exit_cp);
  if (errcode)
    return -errcode;  /* Return negated error code. */

  lj_vmevent_send(L, TEXIT,
    lj_state_checkstack(L, 4+RID_NUM_GPR+RID_NUM_FPR+LUA_MINSTACK);
    setintV(L->top++, J->parent);
    setintV(L->top++, J->exitno);
    trace_exit_regs(L, ex);
  );

  pc = exd.pc;
  cf = cframe_raw(L->cframe);
  setcframe_pc(cf, pc);
  if (G(L)->gc.state == GCSatomic || G(L)->gc.state == GCSfinalize) {
    if (!(G(L)->hookmask & HOOK_GC))
      lj_gc_step(L);  /* Exited because of GC: drive GC forward. */
  } else {
    trace_hotside(J, pc);
  }
  if (bc_op(*pc) == BC_JLOOP) {
    BCIns *retpc = &traceref(J, bc_d(*pc))->startins;
    if (bc_isret(bc_op(*retpc))) {
      if (J->state == LJ_TRACE_RECORD) {
	J->patchins = *pc;
	J->patchpc = (BCIns *)pc;
	*J->patchpc = *retpc;
	J->bcskip = 1;
      } else {
	pc = retpc;
	setcframe_pc(cf, pc);
      }
    }
  }
  /* Return MULTRES or 0. */
  ERRNO_RESTORE
  switch (bc_op(*pc)) {
  case BC_CALLM: case BC_CALLMT:
    return (int)((BCReg)(L->top - L->base) - bc_a(*pc) - bc_c(*pc));
  case BC_RETM:
    return (int)((BCReg)(L->top - L->base) + 1 - bc_a(*pc) - bc_d(*pc));
  case BC_TSETM:
    return (int)((BCReg)(L->top - L->base) + 1 - bc_a(*pc));
  default:
    if (bc_op(*pc) >= BC_FUNCF)
      return (int)((BCReg)(L->top - L->base) + 1);
    return 0;
  }
}